

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trafficlights.cpp
# Opt level: O0

bool __thiscall TrafficLights::changeState(TrafficLights *this,TrafficLightsState *state)

{
  bool res;
  TrafficLightsState *state_local;
  TrafficLights *this_local;
  
  if ((this->_state != (TrafficLightsState *)0x0) && (this->_state != (TrafficLightsState *)0x0)) {
    (*this->_state->_vptr_TrafficLightsState[1])();
  }
  this->_state = state;
  return true;
}

Assistant:

bool TrafficLights::changeState(TrafficLightsState* state)
{
	bool res = true;

	if (_state)
		delete _state;

	_state = state;

	return res;
}